

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

TileParameter * __thiscall caffe::TileParameter::New(TileParameter *this,Arena *arena)

{
  TileParameter *this_00;
  
  this_00 = (TileParameter *)operator_new(0x20);
  TileParameter(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::TileParameter>(arena,this_00);
  }
  return this_00;
}

Assistant:

TileParameter* TileParameter::New(::google::protobuf::Arena* arena) const {
  TileParameter* n = new TileParameter;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}